

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O0

void test_push_doesnt_invalidate_iterator(CuTest *tc)

{
  void *actual;
  void *n;
  int qi;
  int i;
  selist *ql;
  selist *list;
  CuTest *tc_local;
  
  ql = (selist *)0x0;
  _qi = (selist *)0x0;
  n._0_4_ = 0;
  list = (selist *)tc;
  selist_push(&ql,lipsum);
  _qi = ql;
  for (n._4_4_ = 0; n._4_4_ != 0x2a; n._4_4_ = n._4_4_ + 1) {
    actual = selist_get(_qi,(int)n);
    CuAssertPtrEquals_LineMsg
              ((CuTest *)list,
               "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
               ,0xca,(char *)0x0,lipsum + n._4_4_,actual);
    selist_push(&ql,lipsum + (n._4_4_ * 2 + 1));
    selist_advance((selist **)&qi,(int *)&n,1);
    selist_push(&ql,lipsum + (n._4_4_ * 2 + 2));
  }
  selist_free(_qi);
  return;
}

Assistant:

static void test_push_doesnt_invalidate_iterator(CuTest * tc)
{
    struct selist *list = NULL, *ql = NULL;
    int i, qi = 0;
    selist_push(&list, (void*)lipsum);
    ql = list;
    for (i = 0; i != 42; ++i) {
        void * n;
        n = selist_get(ql, qi);
        CuAssertPtrEquals(tc, (void *)(lipsum + i), n);
        selist_push(&list, (void *)(lipsum + (i * 2 + 1)));
        selist_advance(&ql, &qi, 1);
        selist_push(&list, (void *)(lipsum + (i * 2 + 2)));
    }
    selist_free(ql);
}